

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateMemberAccess(ExpressionContext *ctx,SynBase *source,ExprBase *value,SynIdentifier *member,
                  bool allowFailure)

{
  undefined8 uVar1;
  long lVar2;
  long *plVar3;
  Allocator *pAVar4;
  FunctionData *pFVar5;
  TypeFunction *type;
  char *pcVar6;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  FunctionLookupChain chain_01;
  FunctionLookupChain chain_02;
  FunctionLookupChain chain_03;
  FunctionLookupChain chain_04;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  SynBase *pSVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VariableData *pVVar14;
  undefined4 extraout_var_03;
  _func_int **pp_Var15;
  undefined4 extraout_var_05;
  ExprBase *pEVar16;
  TypeBase *pTVar17;
  undefined8 *puVar18;
  TypeRef *pTVar19;
  undefined8 *puVar20;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ExprBase *pEVar21;
  undefined4 extraout_var_10;
  TypeUnsizedArray *pTVar22;
  SynBase *pSVar23;
  FunctionValue *pFVar24;
  FunctionHandle *pFVar25;
  undefined4 extraout_var_12;
  TypeFunctionSet *pTVar26;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TypeBase *pTVar27;
  uint i;
  IntrusiveList<ConstantData> *pIVar28;
  TypeClass *parent;
  IntrusiveList<FunctionHandle> *pIVar29;
  IntrusiveList<MemberHandle> *pIVar30;
  ArrayView<TypeBase_*> setTypes;
  TypeFunction *local_490;
  IntrusiveList<FunctionHandle> overloads;
  FunctionLookupChain function_5;
  FunctionLookupChain function_4;
  FunctionLookupChain function_3;
  FunctionLookupChain function_1;
  FunctionLookupChain function_2;
  FunctionLookupChain function;
  SmallArray<TypeBase_*,_16U> types;
  SmallArray<FunctionValue,_32U> functions;
  SynBase *pSVar12;
  VariableHandle *variable;
  undefined4 extraout_var_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_11;
  
  pTVar27 = value->type;
  pSVar23 = (SynBase *)value;
  if ((pTVar27 == (TypeBase *)0x0) || (pTVar27->typeID != 0x12)) {
    pSVar12 = (SynBase *)value;
    if (value->typeID == 0x16) {
      pSVar23 = (SynBase *)value[1]._vptr_ExprBase;
    }
    else if (value->typeID == 0x22) {
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pTVar19 = ExpressionContext::GetReferenceType(ctx,value->type);
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_02,iVar9);
      pVVar14 = (VariableData *)value[1]._vptr_ExprBase;
      variable->source = value->source;
      variable->variable = pVVar14;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var_01,iVar8),source,&pTVar19->super_TypeBase,
                 variable);
      pSVar23 = (SynBase *)CONCAT44(extraout_var_01,iVar8);
    }
    else if ((pTVar27 == (TypeBase *)0x0) || (pTVar27->typeID != 0x12)) {
      bVar7 = AssertValueExpression(ctx,source,value);
      if (!bVar7) goto LAB_001520d7;
      pSVar23 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pVVar14 = anon_unknown.dwarf_94284::AllocateTemporary(ctx,pSVar23,value->type);
      pEVar16 = CreateVariableAccess(ctx,pSVar23,pVVar14,false);
      pEVar16 = CreateAssignment(ctx,pSVar23,pEVar16,value);
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar21 = (ExprBase *)CONCAT44(extraout_var_03,iVar8);
      pTVar27 = ctx->typeVoid;
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var15 = (_func_int **)CONCAT44(extraout_var_04,iVar8);
      *pp_Var15 = (_func_int *)0x0;
      pp_Var15[1] = (_func_int *)pVVar14;
      pp_Var15[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var15 + 3) = 0;
      pEVar21->typeID = 0x1e;
      pEVar21->source = pSVar23;
      pEVar21->type = pTVar27;
      pEVar21->next = (ExprBase *)0x0;
      pEVar21->listed = false;
      pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
      pEVar21[1]._vptr_ExprBase = pp_Var15;
      *(ExprBase **)&pEVar21[1].typeID = pEVar16;
      pEVar16 = CreateVariableAccess(ctx,pSVar23,pVVar14,false);
      pEVar16 = CreateGetAddress(ctx,pSVar23,pEVar16);
      pSVar23 = (SynBase *)CreateSequence(ctx,source,pEVar21,pEVar16);
    }
  }
  else {
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pSVar12 = (SynBase *)CONCAT44(extraout_var,iVar8);
    pTVar27 = (TypeBase *)pTVar27[1]._vptr_TypeBase;
    *(uint *)&((ExprBase *)&pSVar12->typeID)->_vptr_ExprBase = 0x16;
    ((ExprBase *)&pSVar12->begin)->_vptr_ExprBase = (_func_int **)source;
    ((ExprBase *)&pSVar12->end)->_vptr_ExprBase = (_func_int **)pTVar27;
    ((ExprBase *)&pSVar12->pos)->_vptr_ExprBase = (_func_int **)0x0;
    *(bool *)&((ExprBase *)&(pSVar12->pos).end)->_vptr_ExprBase = false;
    ((ExprBase *)&pSVar12->_vptr_SynBase)->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
    pSVar12->next = (SynBase *)value;
    if ((pTVar27 != (TypeBase *)0x0) && (pTVar27->typeID == 0x12)) {
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pSVar13 = (SynBase *)CONCAT44(extraout_var_00,iVar8);
      pTVar27 = (TypeBase *)pTVar27[1]._vptr_TypeBase;
      *(uint *)&((ExprBase *)&pSVar13->typeID)->_vptr_ExprBase = 0x16;
      ((ExprBase *)&pSVar13->begin)->_vptr_ExprBase = (_func_int **)source;
      ((ExprBase *)&pSVar13->end)->_vptr_ExprBase = (_func_int **)pTVar27;
      ((ExprBase *)&pSVar13->pos)->_vptr_ExprBase = (_func_int **)0x0;
      *(bool *)&((ExprBase *)&(pSVar13->pos).end)->_vptr_ExprBase = false;
      ((ExprBase *)&pSVar13->_vptr_SynBase)->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
      pSVar13->next = pSVar12;
      pSVar23 = pSVar12;
      pSVar12 = pSVar13;
    }
  }
  value = (ExprBase *)pSVar12;
  if (member == (SynIdentifier *)0x0) goto LAB_001520d7;
  pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  if ((pTVar27 != (TypeBase *)0x0) && (pTVar27->typeID == 0x13)) {
    functions.data = (FunctionValue *)0x1e008e;
    functions._8_8_ = (long)"unsigned(size) == size" + 0x16;
    bVar7 = InplaceStr::operator==(&member->name,(InplaceStr *)&functions);
    if (bVar7) {
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar16 = (ExprBase *)CONCAT44(extraout_var_05,iVar8);
      pTVar17 = ctx->typeInt;
      uVar1 = *(undefined8 *)&pTVar27[1].typeID;
      pEVar16->typeID = 6;
      pEVar16->source = source;
      pEVar16->type = pTVar17;
      pEVar16->next = (ExprBase *)0x0;
      pEVar16->listed = false;
      pEVar16->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
      pEVar16[1]._vptr_ExprBase = (_func_int **)uVar1;
      return pEVar16;
    }
  }
  pTVar27 = (TypeBase *)((ExprBase *)&pSVar23->end)->_vptr_ExprBase;
  if ((pTVar27 == (TypeBase *)0x0) || (pTVar27->typeID != 0x12)) {
    pcVar6 = (member->name).begin;
    pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
    iVar8 = (int)(pTVar27->name).begin;
    anon_unknown.dwarf_94284::Stop
              (ctx,source,"ERROR: can\'t access member \'%.*s\' of type \'%.*s\'",
               (ulong)(uint)(*(int *)&(member->name).end - (int)pcVar6),pcVar6,
               (ulong)(uint)(*(int *)&(pTVar27->name).end - iVar8),iVar8);
  }
  if ((*(uint *)&((ExprBase *)&pSVar12->typeID)->_vptr_ExprBase == 8) &&
     (pEVar16 = CreateTypeidMemberAccess(ctx,source,(TypeBase *)pSVar12->next,member),
     pEVar16 != (ExprBase *)0x0)) {
    return pEVar16;
  }
  parent = (TypeClass *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  if (parent == (TypeClass *)0x0) {
    if (ctx->typeAutoRef == (TypeStruct *)0x0) goto LAB_00151c6e;
  }
  else {
    uVar10 = (parent->super_TypeStruct).super_TypeBase.typeID;
    if ((uVar10 < 0x1a) && ((0x3130000U >> (uVar10 & 0x1f) & 1) != 0)) {
      pIVar30 = &(parent->super_TypeStruct).members;
      while (lVar2 = (long)pIVar30->head, lVar2 != 0) {
        bVar7 = InplaceStr::operator==
                          ((InplaceStr *)(*(long *)(*(long *)(lVar2 + 8) + 0x28) + 0x40),
                           &member->name);
        if (bVar7) {
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          puVar18 = (undefined8 *)CONCAT44(extraout_var_06,iVar8);
          pTVar19 = ExpressionContext::GetReferenceType
                              (ctx,*(TypeBase **)(*(long *)(lVar2 + 8) + 0x20));
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          puVar20 = (undefined8 *)CONCAT44(extraout_var_07,iVar8);
          uVar1 = *(undefined8 *)(lVar2 + 8);
          *puVar20 = member;
          puVar20[1] = uVar1;
          puVar20[2] = 0;
          *(undefined1 *)(puVar20 + 3) = 0;
          *(undefined4 *)(puVar18 + 1) = 0x1a;
          puVar18[2] = source;
          puVar18[3] = pTVar19;
          puVar18[4] = 0;
          *(undefined1 *)(puVar18 + 5) = 0;
          *puVar18 = &PTR__ExprBase_00223c88;
          puVar18[6] = pSVar23;
          puVar18[7] = puVar20;
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar16 = (ExprBase *)CONCAT44(extraout_var_08,iVar8);
          lVar2 = *(long *)(lVar2 + 8);
          pTVar27 = *(TypeBase **)(lVar2 + 0x20);
          pEVar16->typeID = 0x16;
          pEVar16->source = source;
          pEVar16->type = pTVar27;
          pEVar16->next = (ExprBase *)0x0;
          pEVar16->listed = false;
          pEVar16->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
          pEVar16[1]._vptr_ExprBase = (_func_int **)puVar18;
          if (*(char *)(lVar2 + 0x35) != '\x01') {
            return pEVar16;
          }
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var_09,iVar8),pEVar16->source,
                     pEVar16->type,pEVar16);
          return &((ExprPassthrough *)CONCAT44(extraout_var_09,iVar8))->super_ExprBase;
        }
        pIVar30 = (IntrusiveList<MemberHandle> *)(lVar2 + 0x18);
      }
      pIVar28 = &(parent->super_TypeStruct).constants;
      while (plVar3 = (long *)pIVar28->head, plVar3 != (long *)0x0) {
        bVar7 = InplaceStr::operator==((InplaceStr *)(*plVar3 + 0x40),&member->name);
        if (bVar7) {
          pEVar16 = CreateLiteralCopy(ctx,source,(ExprBase *)plVar3[1]);
          return pEVar16;
        }
        pIVar28 = (IntrusiveList<ConstantData> *)(plVar3 + 2);
      }
      parent = (TypeClass *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
    }
    if (parent == (TypeClass *)ctx->typeAutoRef) {
LAB_00151c6e:
      pEVar16 = CreateAutoRefFunctionSet(ctx,source,(ExprBase *)pSVar12,member->name);
      return pEVar16;
    }
    if ((((parent != (TypeClass *)0x0) && ((parent->super_TypeStruct).super_TypeBase.typeID == 0x18)
         ) && ((parent->baseClass != (TypeClass *)0x0 || (parent->extendable == true)))) &&
       (pEVar16 = CreateVirtualFunctionSet(ctx,source,(ExprBase *)pSVar23,member->name,parent),
       pEVar16 != (ExprBase *)0x0)) {
      return pEVar16;
    }
  }
  uVar10 = InplaceStr::hash(&member->name);
  pTVar17 = anon_unknown.dwarf_94284::LookupTypeByName(ctx,uVar10);
  pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  bVar7 = false;
  if ((pTVar17 != (TypeBase *)0x0) && (bVar7 = false, pTVar17 == pTVar27)) {
    bVar7 = InplaceStr::operator!=(&pTVar17->name,&member->name);
    pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  }
  uVar10 = NULLC::StringHashContinue(pTVar27->nameHash,"::");
  uVar10 = NULLC::StringHashContinue(uVar10,(member->name).begin,(member->name).end);
  anon_unknown.dwarf_94284::LookupFunctionChainByName(&function,ctx,uVar10);
  if (function.node.node == (Node *)0x0) {
    pEVar16 = (ExprBase *)0x0;
  }
  else {
    chain.node.node = function.node.node;
    chain.node.start = function.node.start;
    chain.scope = function.scope;
    pEVar16 = CreateFunctionAccess(ctx,source,chain,(ExprBase *)pSVar23);
  }
  if (pEVar16 == (ExprBase *)0x0 && (bVar7 ^ 1U) == 0) {
    pEVar16 = CreateConstructorAccess
                        (ctx,source,(TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase,false,
                         (ExprBase *)pSVar23);
  }
  pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  if (pEVar16 == (ExprBase *)0x0) {
    if (pTVar27 != (TypeBase *)0x0) {
      if (pTVar27->typeID == 0x13) {
        pTVar22 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar27[1]._vptr_TypeBase);
        uVar11 = NULLC::StringHashContinue((pTVar22->super_TypeStruct).super_TypeBase.nameHash,"::")
        ;
        uVar11 = NULLC::StringHashContinue(uVar11,(member->name).begin,(member->name).end);
        anon_unknown.dwarf_94284::LookupFunctionChainByName(&function_2,ctx,uVar11);
        if (function_2.node.node != (Node *)0x0) {
          pTVar19 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pTVar22);
          pEVar16 = CreateCast(ctx,source,(ExprBase *)pSVar23,&pTVar19->super_TypeBase,false);
          chain_00.node.node = function_2.node.node;
          chain_00.node.start = function_2.node.start;
          chain_00.scope = function_2.scope;
          pEVar16 = CreateFunctionAccess(ctx,source,chain_00,pEVar16);
          return pEVar16;
        }
        pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
        goto LAB_001519d7;
      }
      goto LAB_00151a9b;
    }
  }
  else {
LAB_001519d7:
    if (pTVar27 != (TypeBase *)0x0) {
LAB_00151a9b:
      if ((pTVar27->typeID == 0x18) &&
         (pTVar27 = *(TypeBase **)&pTVar27[2].typeIndex, pTVar27 != (TypeBase *)0x0)) {
        uVar11 = NULLC::StringHashContinue(pTVar27->nameHash,"::");
        uVar11 = NULLC::StringHashContinue(uVar11,(member->name).begin,(member->name).end);
        anon_unknown.dwarf_94284::LookupFunctionChainByName(&function_1,ctx,uVar11);
        if (function_1.node.node == (Node *)0x0) {
          pEVar21 = (ExprBase *)0x0;
        }
        else {
          chain_01.node.node = function_1.node.node;
          chain_01.node.start = function_1.node.start;
          chain_01.scope = function_1.scope;
          pEVar21 = CreateFunctionAccess(ctx,source,chain_01,(ExprBase *)pSVar23);
        }
        if ((bVar7 ^ 1U) == 0 && pEVar21 == (ExprBase *)0x0) {
          pEVar21 = CreateConstructorAccess(ctx,source,pTVar27,false,(ExprBase *)pSVar23);
        }
        if ((pEVar16 != (ExprBase *)0x0) && (pEVar21 != (ExprBase *)0x0)) {
          pAVar4 = ctx->allocator;
          types.data = types.little;
          types.count = 0;
          types.max = 0x10;
          overloads.head = (FunctionHandle *)0x0;
          overloads.tail = (FunctionHandle *)0x0;
          types.allocator = pAVar4;
          memset(functions.little,0,0x300);
          functions.count = 0;
          functions.max = 0x20;
          functions.data = functions.little;
          functions.allocator = pAVar4;
          GetNodeFunctions(ctx,source,pEVar16,&functions);
          GetNodeFunctions(ctx,source,pEVar21,&functions);
          for (uVar10 = 0; uVar10 < functions.count; uVar10 = uVar10 + 1) {
            pFVar24 = SmallArray<FunctionValue,_32U>::operator[](&functions,uVar10);
            pFVar5 = pFVar24->function;
            bVar7 = false;
            pIVar29 = &overloads;
            while ((pFVar25 = pIVar29->head, pFVar25 != (FunctionHandle *)0x0 && (bVar7 == false)))
            {
              bVar7 = anon_unknown.dwarf_94284::SameArguments(pFVar25->function->type,pFVar5->type);
              pIVar29 = (IntrusiveList<FunctionHandle> *)&pFVar25->next;
            }
            if (bVar7 == false) {
              local_490 = pFVar5->type;
              SmallArray<TypeBase_*,_16U>::push_back(&types,(TypeBase **)&local_490);
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
              pFVar25 = (FunctionHandle *)CONCAT44(extraout_var_11,iVar8);
              pFVar25->function = pFVar5;
              pFVar25->next = (FunctionHandle *)0x0;
              pFVar25->listed = false;
              IntrusiveList<FunctionHandle>::push_back(&overloads,pFVar25);
            }
          }
          setTypes.count = types.count;
          setTypes.data = types.data;
          setTypes._12_4_ = 0;
          pTVar26 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pEVar16 = (ExprBase *)CONCAT44(extraout_var_13,iVar8);
          pEVar16->typeID = 0x27;
          pEVar16->source = source;
          pEVar16->type = &pTVar26->super_TypeBase;
          pEVar16->next = (ExprBase *)0x0;
          pEVar16->listed = false;
          pEVar16->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223e80;
          pEVar16[1]._vptr_ExprBase = (_func_int **)overloads.head;
          *(FunctionHandle **)&pEVar16[1].typeID = overloads.tail;
          pEVar16[1].source = pSVar23;
          SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
          SmallArray<TypeBase_*,_16U>::~SmallArray(&types);
          return pEVar16;
        }
        if (pEVar16 != (ExprBase *)0x0) {
          return pEVar16;
        }
        if (pEVar21 != (ExprBase *)0x0) {
          if (pEVar21->typeID != 0x26) {
            return pEVar21;
          }
          lVar2 = *(long *)(*(long *)((long)pEVar21[1]._vptr_ExprBase + 0x18) + 0x20);
          if (lVar2 == 0) {
            return pEVar21;
          }
          if (*(char *)(lVar2 + 0x3c) != '\x01') {
            return pEVar21;
          }
          type = *(TypeFunction **)((long)pEVar21[1]._vptr_ExprBase + 0x28);
          if ((type->super_TypeBase).isGeneric != false) {
            return pEVar21;
          }
          GetFunctionForType((FunctionValue *)&functions,ctx,source,pEVar21,type);
          uVar1 = functions._8_8_;
          if (functions._8_8_ == 0) {
            return pEVar21;
          }
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          ExprFunctionAccess::ExprFunctionAccess
                    ((ExprFunctionAccess *)CONCAT44(extraout_var_12,iVar8),(SynBase *)functions.data
                     ,*(TypeBase **)(uVar1 + 0x28),(FunctionData *)uVar1,
                     (ExprBase *)functions.little[0].source);
          return &((ExprFunctionAccess *)CONCAT44(extraout_var_12,iVar8))->super_ExprBase;
        }
        goto LAB_00151b30;
      }
    }
    if (pEVar16 != (ExprBase *)0x0) {
      return pEVar16;
    }
  }
LAB_00151b30:
  uVar10 = NULLC::StringHashContinue(uVar10,"$");
  anon_unknown.dwarf_94284::LookupFunctionChainByName(&function_3,ctx,uVar10);
  if ((function_3.node.node != (Node *)0x0) &&
     (chain_02.node.node = function_3.node.node, chain_02.node.start = function_3.node.start,
     chain_02.scope = function_3.scope,
     pEVar16 = CreateFunctionAccess(ctx,source,chain_02,(ExprBase *)pSVar23),
     pEVar16 != (ExprBase *)0x0)) {
LAB_00151b95:
    pEVar16 = CreateFunctionCall(ctx,source,pEVar16,(IntrusiveList<TypeHandle>)ZEXT816(0),
                                 (SynCallArgument *)0x0,false);
    pTVar27 = pEVar16->type;
    if (pTVar27 == (TypeBase *)0x0) {
      return pEVar16;
    }
    if (pTVar27->typeID != 0x12) {
      return pEVar16;
    }
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar21 = (ExprBase *)CONCAT44(extraout_var_10,iVar8);
    pTVar27 = (TypeBase *)pTVar27[1]._vptr_TypeBase;
    pEVar21->typeID = 0x16;
    pEVar21->source = source;
    pEVar21->type = pTVar27;
    pEVar21->next = (ExprBase *)0x0;
    pEVar21->listed = false;
    pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
    pEVar21[1]._vptr_ExprBase = (_func_int **)pEVar16;
    return pEVar21;
  }
  pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  if (pTVar27 != (TypeBase *)0x0) {
    if (pTVar27->typeID == 0x13) {
      pTVar22 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar27[1]._vptr_TypeBase);
      uVar10 = NULLC::StringHashContinue((pTVar22->super_TypeStruct).super_TypeBase.nameHash,"::");
      uVar10 = NULLC::StringHashContinue(uVar10,(member->name).begin,(member->name).end);
      anon_unknown.dwarf_94284::LookupFunctionChainByName(&function_4,ctx,uVar10);
      if (function_4.node.node != (Node *)0x0) {
        pTVar19 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pTVar22);
        pSVar23 = (SynBase *)
                  CreateCast(ctx,source,(ExprBase *)pSVar23,&pTVar19->super_TypeBase,false);
        chain_03.node.node = function_4.node.node;
        chain_03.node.start = function_4.node.start;
        chain_03.scope = function_4.scope;
        pEVar16 = CreateFunctionAccess(ctx,source,chain_03,(ExprBase *)pSVar23);
        if (pEVar16 != (ExprBase *)0x0) goto LAB_00151b95;
      }
    }
    pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
    if (((pTVar27 != (TypeBase *)0x0) && (pTVar27->typeID == 0x18)) &&
       (*(long *)&pTVar27[2].typeIndex != 0)) {
      uVar10 = NULLC::StringHashContinue(*(uint *)(*(long *)&pTVar27[2].typeIndex + 0xc),"::");
      uVar10 = NULLC::StringHashContinue(uVar10,(member->name).begin,(member->name).end);
      uVar10 = NULLC::StringHashContinue(uVar10,"$");
      anon_unknown.dwarf_94284::LookupFunctionChainByName(&function_5,ctx,uVar10);
      if (function_5.node.node != (Node *)0x0) {
        chain_04.node.node = function_5.node.node;
        chain_04.node.start = function_5.node.start;
        chain_04.scope = function_5.scope;
        pEVar16 = CreateFunctionAccess(ctx,source,chain_04,(ExprBase *)pSVar23);
        goto LAB_00151b95;
      }
    }
  }
  if (allowFailure) {
    return (ExprBase *)0x0;
  }
  pcVar6 = (member->name).begin;
  pTVar27 = (TypeBase *)((ExprBase *)&pSVar12->end)->_vptr_ExprBase;
  iVar8 = (int)(pTVar27->name).begin;
  anon_unknown.dwarf_94284::Report
            (ctx,source,
             "ERROR: member variable or function \'%.*s\' is not defined in class \'%.*s\'",
             (ulong)(uint)(*(int *)&(member->name).end - (int)pcVar6),pcVar6,
             (ulong)(uint)(*(int *)&(pTVar27->name).end - iVar8),iVar8);
LAB_001520d7:
  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar16 = (ExprBase *)CONCAT44(extraout_var_14,iVar8);
  pTVar27 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  pEVar16->typeID = 0x1a;
  pEVar16->source = source;
  pEVar16->type = pTVar27;
  pEVar16->next = (ExprBase *)0x0;
  pEVar16->listed = false;
  pEVar16->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223c88;
  pEVar16[1]._vptr_ExprBase = (_func_int **)value;
  *(undefined8 *)&pEVar16[1].typeID = 0;
  return pEVar16;
}

Assistant:

ExprBase* CreateMemberAccess(ExpressionContext &ctx, SynBase *source, ExprBase *value, SynIdentifier *member, bool allowFailure)
{
	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(TypeRef *refType = getType<TypeRef>(value->type))
		{
			wrapped = value;

			value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);
		}
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(!member)
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

	if(TypeArray *node = getType<TypeArray>(value->type))
	{
		if(member->name == InplaceStr("size"))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, node->length);
	}

	if(isType<TypeRef>(wrapped->type))
	{
		if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(value))
		{
			if(ExprBase *result = CreateTypeidMemberAccess(ctx, source, node->value, member))
				return result;
		}

		if(TypeStruct *node = getType<TypeStruct>(value->type))
		{
			// Search for a member variable
			for(MemberHandle *el = node->members.head; el; el = el->next)
			{
				if(el->variable->name->name == member->name)
				{
					// Member access only shifts an address, so we are left with a reference to get value from
					ExprMemberAccess *shift = new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetReferenceType(el->variable->type), wrapped, new (ctx.get<VariableHandle>()) VariableHandle(member, el->variable));

					ExprBase *memberValue = new (ctx.get<ExprDereference>()) ExprDereference(source, el->variable->type, shift);

					if(el->variable->isReadonly)
						return new (ctx.get<ExprPassthrough>()) ExprPassthrough(memberValue->source, memberValue->type, memberValue);

					return memberValue;
				}
			}

			// Search for a member constant
			for(ConstantData *curr = node->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == member->name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}

		if(value->type == ctx.typeAutoRef)
			return CreateAutoRefFunctionSet(ctx, source, value, member->name);

		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(classType->baseClass != NULL || classType->extendable)
			{
				if(ExprBase *overloads = CreateVirtualFunctionSet(ctx, source, wrapped, member->name, classType))
					return overloads;
			}
		}

		// Check if a name resembles a type alias of the value class
		TypeBase *aliasType = NULL;

		if(TypeBase *type = LookupTypeByName(ctx, member->name.hash()))
		{
			if(type == value->type && type->name != member->name)
			{
				if(TypeClass *typeClass = getType<TypeClass>(type))
				{
					if(typeClass->proto)
						type = typeClass->proto;
				}

				aliasType = type;
			}
		}

		// Look for a member function
		ExprBase *mainFuncton = NULL;

		unsigned hash = NULLC::StringHashContinue(value->type->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			mainFuncton = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!mainFuncton && aliasType)
			mainFuncton = CreateConstructorAccess(ctx, source, value->type, false, wrapped);

		if(!mainFuncton)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					return CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		ExprBase *baseFunction = NULL;

		// Look for a member function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
					baseFunction = CreateFunctionAccess(ctx, source, function, wrapped);

				if(!baseFunction && aliasType)
					baseFunction = CreateConstructorAccess(ctx, source, protoType, false, wrapped);
			}
		}

		// Add together instantiated and generic base functions
		if(mainFuncton && baseFunction)
		{
			SmallArray<TypeBase*, 16> types(ctx.allocator);
			IntrusiveList<FunctionHandle> overloads;

			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, mainFuncton, functions);
			GetNodeFunctions(ctx, source, baseFunction, functions);

			for(unsigned i = 0; i < functions.size(); i++)
			{
				FunctionValue function = functions[i];

				bool instantiated = false;

				for(FunctionHandle *curr = overloads.head; curr && !instantiated; curr = curr->next)
				{
					if(SameArguments(curr->function->type, function.function->type))
						instantiated = true;
				}

				if(instantiated)
					continue;

				types.push_back(function.function->type);
				overloads.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function.function));
			}

			TypeFunctionSet *type = ctx.GetFunctionSetType(types);

			return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, overloads, wrapped);
		}

		if(mainFuncton)
			return mainFuncton;

		if(baseFunction)
		{
			if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(baseFunction))
			{
				if(node->function->scope->ownerType && node->function->scope->ownerType->isGeneric && !node->function->type->isGeneric)
				{
					if(FunctionValue bestOverload = GetFunctionForType(ctx, source, baseFunction, node->function->type))
						return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
				}
			}

			return baseFunction;
		}

		// Look for an accessor
		hash = NULLC::StringHashContinue(hash, "$");

		ExprBase *access = NULL;

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			access = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!access)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					access = CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		if(access)
		{
			ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);;

			if(TypeRef *refType = getType<TypeRef>(call->type))
				return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

			return call;
		}

		// Look for an accessor function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				// Look for an accessor
				hash = NULLC::StringHashContinue(hash, "$");

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					ExprBase *access = CreateFunctionAccess(ctx, source, function, wrapped);

					ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);

					if(TypeRef *refType = getType<TypeRef>(call->type))
						return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

					return call;
				}
			}
		}

		if(allowFailure)
			return NULL;

		Report(ctx, source, "ERROR: member variable or function '%.*s' is not defined in class '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);
	}

	Stop(ctx, source, "ERROR: can't access member '%.*s' of type '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

	return NULL;
}